

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gls::Functional::anon_unknown_0::ScissorCase::iterate(ScissorCase *this)

{
  ostringstream *poVar1;
  TextureFormat log;
  RenderContext *pRVar2;
  bool bVar3;
  int iVar4;
  ContextType type;
  GLSLVersion version;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar7;
  undefined4 extraout_var_01;
  byte bVar8;
  int iVar9;
  int iVar10;
  char *description;
  qpTestResult testResult;
  int iVar11;
  Vector<float,_4> VVar12;
  RandomViewport viewport;
  Vector<int,_4> local_318;
  Surface refImage;
  Surface resImage;
  IVec4 local_2d8;
  Vec4 threshold;
  ConstPixelBufferAccess local_2b8;
  undefined1 local_288 [392];
  ShaderProgram shader;
  long lVar6;
  undefined4 extraout_var_00;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  log = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar7 = CONCAT44(extraout_var_00,iVar4);
  iVar9 = 8 - *(int *)(lVar7 + 8);
  iVar11 = 8 - *(int *)(lVar7 + 0xc);
  iVar4 = 8 - *(int *)(lVar7 + 0x10);
  iVar10 = 8 - *(int *)(lVar7 + 0x14);
  bVar8 = (byte)iVar9;
  if (iVar9 < 1) {
    bVar8 = 0;
  }
  testResult = QP_TEST_RESULT_FAIL;
  shader.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1 << (bVar8 & 0x1f);
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  shader.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 1 << ((byte)iVar11 & 0x1f);
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  shader.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 1 << ((byte)iVar4 & 0x1f);
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  shader.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 1 << ((byte)iVar10 & 0x1f);
  tcu::Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)local_288);
  VVar12 = tcu::operator*((tcu *)&threshold,0.02,(Vector<float,_4> *)local_288);
  pRVar2 = this->m_renderCtx;
  type.super_ApiType.m_bits =
       (ApiType)(*pRVar2->_vptr_RenderContext[2])(VVar12.m_data._0_8_,VVar12.m_data._8_8_,pRVar2);
  version = glu::getContextTypeGLSLVersion(type);
  genShaders((ProgramSources *)local_288,version);
  glu::ShaderProgram::ShaderProgram(&shader,pRVar2,(ProgramSources *)local_288);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_288);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar5 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_01,iVar4),0x100,0x100,dVar5);
  local_2d8.m_data[0] = (int)((this->m_scissorArea).m_data[0] * (float)viewport.width);
  local_2d8.m_data[1] = (int)((this->m_scissorArea).m_data[1] * (float)viewport.height);
  local_318.m_data[2] = (int)((this->m_scissorArea).m_data[2] * (float)viewport.width);
  local_318.m_data[3] = (int)((this->m_scissorArea).m_data[3] * (float)viewport.height);
  local_318.m_data[0] = viewport.x + local_2d8.m_data[0];
  local_318.m_data[1] = viewport.y + local_2d8.m_data[1];
  local_2d8.m_data[2] = local_318.m_data[2];
  local_2d8.m_data[3] = local_318.m_data[3];
  tcu::Surface::Surface(&refImage,viewport.width,viewport.height);
  tcu::Surface::Surface(&resImage,viewport.width,viewport.height);
  if (shader.m_program.m_info.linkOk == false) {
    glu::operator<<((TestLog *)log,&shader);
    description = "Shader compile/link failed";
  }
  else {
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Viewport area is ");
    tcu::operator<<((ostream *)poVar1,(Vector<int,_4> *)&local_2b8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Scissor area is ");
    tcu::operator<<((ostream *)poVar1,&local_318);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Rendering reference (scissors disabled)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar6 + 0x1680))(shader.m_program.m_program);
    (**(code **)(lVar6 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
    (**(code **)(lVar6 + 0x1c0))(0x3e000000,0x3e800000);
    (**(code **)(lVar6 + 0x1d0))(0x3f800000);
    (**(code **)(lVar6 + 0x208))(0);
    (**(code **)(lVar6 + 0x4e8))(0xb71);
    (**(code **)(lVar6 + 0x4e8))(0xb90);
    (**(code **)(lVar6 + 0x4e8))(0xc11);
    (**(code **)(lVar6 + 0x188))(0x4500);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
              (this,(ulong)shader.m_program.m_program);
    iVar9 = viewport.y;
    iVar4 = viewport.x;
    pRVar2 = this->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_288,&refImage);
    glu::readPixels(pRVar2,iVar4,iVar9,(PixelBufferAccess *)local_288);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0xf5);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Rendering result (scissors enabled)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar6 + 0x1680))(shader.m_program.m_program);
    (**(code **)(lVar6 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
    (**(code **)(lVar6 + 0x1c0))(0x3e000000,0x3e800000);
    (**(code **)(lVar6 + 0x1d0))(0x3f800000);
    (**(code **)(lVar6 + 0x208))(0);
    (**(code **)(lVar6 + 0x4e8))(0xb71);
    (**(code **)(lVar6 + 0x4e8))(0xb90);
    (**(code **)(lVar6 + 0x4e8))(0xc11);
    (**(code **)(lVar6 + 0x188))(0x4500);
    (**(code **)(lVar6 + 0x1290))
              (local_318.m_data[0],local_318.m_data[1],local_318.m_data[2],local_318.m_data[3]);
    (**(code **)(lVar6 + 0x5e0))(0xc11);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
              (this,(ulong)shader.m_program.m_program);
    pRVar2 = this->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_288,&resImage);
    glu::readPixels(pRVar2,viewport.x,viewport.y,(PixelBufferAccess *)local_288);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0x10d);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Clearing area outside scissor area from reference");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::Surface::getAccess((PixelBufferAccess *)local_288,&refImage);
    local_2b8.m_format.order = 0x20;
    local_2b8.m_format.type = 0x40;
    local_2b8.m_size.m_data[0] = 0x80;
    local_2b8.m_size.m_data[1] = 0xff;
    Functional::(anonymous_namespace)::clearEdges<tcu::Vector<int,4>>
              ((PixelBufferAccess *)local_288,(Vector<int,_4> *)&local_2b8,&local_2d8);
    tcu::Surface::getAccess((PixelBufferAccess *)local_288,&refImage);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_2b8,&resImage);
    bVar3 = tcu::floatThresholdCompare
                      ((TestLog *)log,"ComparisonResult","Image comparison result",
                       (ConstPixelBufferAccess *)local_288,&local_2b8,&threshold,COMPARE_LOG_RESULT)
    ;
    testResult = (qpTestResult)!bVar3;
    description = "Image comparison failed";
    if (bVar3) {
      description = "Pass";
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,testResult,description);
  tcu::Surface::~Surface(&resImage);
  tcu::Surface::~Surface(&refImage);
  glu::ShaderProgram::~ShaderProgram(&shader);
  return STOP;
}

Assistant:

ScissorCase::IterateResult ScissorCase::iterate (void)
{
	using TextureTestUtil::RandomViewport;

	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	TestLog&					log				= m_testCtx.getLog();
	const tcu::PixelFormat		renderFormat	= m_renderCtx.getRenderTarget().getPixelFormat();
	const tcu::Vec4				threshold		= 0.02f * UVec4(1u << de::max(0, 8 - renderFormat.redBits),
																1u << de::max(0, 8 - renderFormat.greenBits),
																1u << de::max(0, 8 - renderFormat.blueBits),
																1u << de::max(0, 8 - renderFormat.alphaBits)).asFloat();
	const glu::ShaderProgram	shader			(m_renderCtx, genShaders(glu::getContextTypeGLSLVersion(m_renderCtx.getType())));

	const RandomViewport		viewport		(m_renderCtx.getRenderTarget(), 256, 256, deStringHash(getName()));
	const IVec4					relScissorArea	(int(m_scissorArea.x() * (float)viewport.width),
												 int(m_scissorArea.y() * (float)viewport.height),
												 int(m_scissorArea.z() * (float)viewport.width),
												 int(m_scissorArea.w() * (float)viewport.height));
	const IVec4					absScissorArea	(relScissorArea.x() + viewport.x,
												 relScissorArea.y() + viewport.y,
												 relScissorArea.z(),
												 relScissorArea.w());

	tcu::Surface				refImage		(viewport.width, viewport.height);
	tcu::Surface				resImage		(viewport.width, viewport.height);

	if (!shader.isOk())
	{
		log << shader;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader compile/link failed");
		return STOP;
	}

	log << TestLog::Message << "Viewport area is " << IVec4(viewport.x, viewport.y, viewport.width, viewport.height) << TestLog::EndMessage;
	log << TestLog::Message << "Scissor area is " << absScissorArea << TestLog::EndMessage;

	// Render reference (no scissors)
	{
		log << TestLog::Message << "Rendering reference (scissors disabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

		gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
		gl.clearDepthf(1.0f);
		gl.clearStencil(0);
		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

		render(shader.getProgram(), IVec4(viewport.x, viewport.y, viewport.width, viewport.height));

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, refImage.getAccess());
		GLU_CHECK_ERROR(gl.getError());
	}

	// Render result (scissors)
	{
		log << TestLog::Message << "Rendering result (scissors enabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

		gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
		gl.clearDepthf(1.0f);
		gl.clearStencil(0);
		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

		gl.scissor(absScissorArea.x(), absScissorArea.y(), absScissorArea.z(), absScissorArea.w());
		gl.enable(GL_SCISSOR_TEST);

		render(shader.getProgram(), IVec4(viewport.x, viewport.y, viewport.width, viewport.height));

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, resImage.getAccess());
		GLU_CHECK_ERROR(gl.getError());
	}

	// Manual 'scissors' for reference image
	log << TestLog::Message << "Clearing area outside scissor area from reference" << TestLog::EndMessage;
	clearEdges(refImage.getAccess(), IVec4(32, 64, 128, 255), relScissorArea);

	if (tcu::floatThresholdCompare(log, "ComparisonResult", "Image comparison result", refImage.getAccess(), resImage.getAccess(), threshold, tcu::COMPARE_LOG_RESULT))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	return STOP;
}